

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O1

int utest_should_filter_test(char *filter,char *testcase)

{
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  bool bVar6;
  
  if (filter == (char *)0x0) {
    return 0;
  }
  pcVar3 = (char *)CONCAT71((int7)((ulong)in_RAX >> 8),*filter);
  iVar2 = (int)pcVar3;
  bVar6 = *filter == '\0';
  pcVar4 = filter;
  if (bVar6) {
LAB_0010b6ec:
    if ((*testcase == '\0') || ((iVar2 = 1, pcVar4 != filter && (pcVar4[-1] == '*')))) {
      bVar6 = true;
      goto LAB_0010b70c;
    }
  }
  else {
    cVar5 = *testcase;
    while (iVar2 = (int)pcVar3, cVar5 != '\0') {
      if ((char)pcVar3 == '*') {
        pcVar3 = pcVar4 + 1;
        cVar5 = pcVar4[1];
        bVar6 = cVar5 == '\0';
        if (bVar6) {
LAB_0010b6b8:
          if (*testcase == '\0') {
            iVar2 = 0;
            goto LAB_0010b70a;
          }
        }
        else {
          if (cVar5 != '*') {
            cVar1 = *testcase;
            while (cVar1 != '\0') {
              testcase = testcase + 1;
              if (cVar5 != cVar1) {
                pcVar3 = pcVar4;
              }
              cVar5 = pcVar3[1];
              pcVar3 = pcVar3 + 1;
              bVar6 = cVar5 == '\0';
              if (bVar6) goto LAB_0010b6b8;
              if (cVar5 == '*') break;
              cVar1 = *testcase;
            }
          }
          if (bVar6) goto LAB_0010b6b8;
        }
        pcVar4 = pcVar3;
        if (*testcase == '\0') goto LAB_0010b705;
      }
      else {
        if (cVar5 != (char)pcVar3) goto LAB_0010b705;
        testcase = testcase + 1;
        pcVar4 = pcVar4 + 1;
      }
      pcVar3 = (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),*pcVar4);
      iVar2 = (int)pcVar3;
      bVar6 = *pcVar4 == '\0';
      if (bVar6) goto LAB_0010b6ec;
      cVar5 = *testcase;
    }
    if (bVar6) goto LAB_0010b6ec;
LAB_0010b705:
    iVar2 = 1;
  }
LAB_0010b70a:
  bVar6 = false;
LAB_0010b70c:
  if (bVar6) {
    return 0;
  }
  return iVar2;
}

Assistant:

UTEST_WEAK int utest_should_filter_test(const char *filter,
                                        const char *testcase) {
  if (filter) {
    const char *filter_cur = filter;
    const char *testcase_cur = testcase;
    const char *filter_wildcard = 0;

    while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
      if ('*' == *filter_cur) {
        /* store the position of the wildcard */
        filter_wildcard = filter_cur;

        /* skip the wildcard character */
        filter_cur++;

        while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
          if ('*' == *filter_cur) {
            /*
               we found another wildcard (filter is something like *foo*) so we
               exit the current loop, and return to the parent loop to handle
               the wildcard case
            */
            break;
          } else if (*filter_cur != *testcase_cur) {
            /* otherwise our filter didn't match, so reset it */
            filter_cur = filter_wildcard;
          }

          /* move testcase along */
          testcase_cur++;

          /* move filter along */
          filter_cur++;
        }

        if (('\0' == *filter_cur) && ('\0' == *testcase_cur)) {
          return 0;
        }

        /* if the testcase has been exhausted, we don't have a match! */
        if ('\0' == *testcase_cur) {
          return 1;
        }
      } else {
        if (*testcase_cur != *filter_cur) {
          /* test case doesn't match filter */
          return 1;
        } else {
          /* move our filter and testcase forward */
          testcase_cur++;
          filter_cur++;
        }
      }
    }

    if (('\0' != *filter_cur) ||
        (('\0' != *testcase_cur) &&
         ((filter == filter_cur) || ('*' != filter_cur[-1])))) {
      /* we have a mismatch! */
      return 1;
    }
  }

  return 0;
}